

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

Estimate<double> * __thiscall
Catch::Benchmark::Detail::
bootstrap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)>
          (Estimate<double> *__return_storage_ptr__,Detail *this,double confidence_level,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last,
          sample *resample,
          _func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
          **estimator)

{
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  int iVar1;
  uint uVar2;
  int iVar3;
  difference_type dVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_00;
  int iVar5;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_tests_catch_amalgamated_hpp:2366:81)>
  __pred;
  anon_class_8_1_074dbec5 __binary_op;
  double dVar6;
  double p;
  ulong uVar7;
  pair<double,_double> pVar8;
  anon_class_4_1_54a3980e cumn;
  sample jack;
  anon_class_4_1_54a3980e local_74;
  double local_70;
  double local_68;
  ulong uStack_60;
  double local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  last_00._M_current = (double *)resample;
  __pred._M_pred.point =
       (anon_class_8_1_a87844b0_for__M_pred)
       (*(code *)(resample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start)(this,first._M_current);
  if ((long)first._M_current - (long)this == 8) {
    __return_storage_ptr__->point = (double)__pred._M_pred.point;
    __return_storage_ptr__->lower_bound = (double)__pred._M_pred.point;
    __return_storage_ptr__->upper_bound = (double)__pred._M_pred.point;
    __return_storage_ptr__->confidence_interval = confidence_level;
  }
  else {
    jackknife<double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>),__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((sample *)&local_48,(Detail *)resample,
               (_func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
                **)this,first,last_00);
    __binary_op.jack_mean =
         mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                   ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                    local_48._M_impl.super__Vector_impl_data._M_start,
                    (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                    local_48._M_impl.super__Vector_impl_data._M_finish);
    uVar7 = 0;
    pVar8 = std::
            accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::pair<double,double>,Catch::Benchmark::Detail::bootstrap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)>(double,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::vector<double,std::allocator<double>>const&,double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>))::_lambda(std::pair<double,double>,double)_1_>
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                       local_48._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                       local_48._M_impl.super__Vector_impl_data._M_finish,
                       (pair<double,_double>)ZEXT816(0),__binary_op);
    local_68 = pVar8.second;
    uStack_60 = uVar7;
    dVar6 = pow(pVar8.first,1.5);
    __first._M_current = (double *)*last._M_current;
    __last._M_current = (double *)last._M_current[1];
    dVar4 = std::
            __count_if<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_pred<Catch::Benchmark::Detail::bootstrap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)>(double,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::vector<double,std::allocator<double>>const&,double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>))::_lambda(double)_1_>>
                      (__first,__last,__pred);
    iVar5 = (int)((ulong)((long)__last._M_current - (long)__first._M_current) >> 3);
    p = (double)dVar4 / (double)iVar5;
    if ((p != 0.0) || (NAN(p))) {
      local_70 = normal_quantile(p);
      local_50 = normal_quantile((1.0 - confidence_level) * 0.5);
      uStack_60 = uStack_60 ^ 0x8000000000000000;
      local_68 = -local_68 / (dVar6 * 6.0);
      local_74.n = iVar5;
      uVar2 = bootstrap<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_double_(*&)(__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)>
              ::anon_class_4_1_54a3980e::operator()
                        (&local_74,
                         (local_70 + local_50) / (local_68 * (local_70 + local_50) + 1.0) + local_70
                        );
      iVar3 = bootstrap<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_double_(*&)(__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)>
              ::anon_class_4_1_54a3980e::operator()
                        (&local_74,
                         (local_70 - local_50) / (local_68 * (local_70 - local_50) + 1.0) + local_70
                        );
      uVar7 = 0;
      if (0 < (int)uVar2) {
        uVar7 = (ulong)uVar2;
      }
      iVar1 = iVar5 + -1;
      if (iVar3 <= iVar5 + -1) {
        iVar1 = iVar3;
      }
      __return_storage_ptr__->point = (double)__pred._M_pred.point;
      dVar6 = *last._M_current;
      __return_storage_ptr__->lower_bound = *(double *)((long)dVar6 + uVar7 * 8);
      __return_storage_ptr__->upper_bound = *(double *)((long)dVar6 + (long)iVar1 * 8);
      __return_storage_ptr__->confidence_interval = confidence_level;
    }
    else {
      __return_storage_ptr__->point = (double)__pred._M_pred.point;
      __return_storage_ptr__->lower_bound = (double)__pred._M_pred.point;
      __return_storage_ptr__->upper_bound = (double)__pred._M_pred.point;
      __return_storage_ptr__->confidence_interval = confidence_level;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Estimate<double> bootstrap(double confidence_level, Iterator first, Iterator last, sample const& resample, Estimator&& estimator) {
                auto n_samples = last - first;

                double point = estimator(first, last);
                // Degenerate case with a single sample
                if (n_samples == 1) return { point, point, point, confidence_level };

                sample jack = jackknife(estimator, first, last);
                double jack_mean = mean(jack.begin(), jack.end());
                double sum_squares, sum_cubes;
                std::tie(sum_squares, sum_cubes) = std::accumulate(jack.begin(), jack.end(), std::make_pair(0., 0.), [jack_mean](std::pair<double, double> sqcb, double x) -> std::pair<double, double> {
                    auto d = jack_mean - x;
                    auto d2 = d * d;
                    auto d3 = d2 * d;
                    return { sqcb.first + d2, sqcb.second + d3 };
                });

                double accel = sum_cubes / (6 * std::pow(sum_squares, 1.5));
                int n = static_cast<int>(resample.size());
                double prob_n = std::count_if(resample.begin(), resample.end(), [point](double x) { return x < point; }) / (double)n;
                // degenerate case with uniform samples
                if (prob_n == 0) return { point, point, point, confidence_level };

                double bias = normal_quantile(prob_n);
                double z1 = normal_quantile((1. - confidence_level) / 2.);

                auto cumn = [n](double x) -> int {
                    return std::lround(normal_cdf(x) * n); };
                auto a = [bias, accel](double b) { return bias + b / (1. - accel * b); };
                double b1 = bias + z1;
                double b2 = bias - z1;
                double a1 = a(b1);
                double a2 = a(b2);
                auto lo = std::max(cumn(a1), 0);
                auto hi = std::min(cumn(a2), n - 1);

                return { point, resample[lo], resample[hi], confidence_level };
            }